

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcolr.c
# Opt level: O0

FT_Bool find_base_glyph_v1_record
                  (FT_Byte *base_glyph_begin,FT_UInt num_base_glyph,FT_UInt glyph_id,
                  BaseGlyphV1Record *record)

{
  ushort uVar1;
  uint uVar2;
  FT_UShort gid;
  FT_Byte *p;
  uint local_30;
  FT_UInt mid;
  FT_UInt max;
  FT_UInt min;
  BaseGlyphV1Record *record_local;
  FT_UInt glyph_id_local;
  FT_UInt num_base_glyph_local;
  FT_Byte *base_glyph_begin_local;
  
  mid = 0;
  local_30 = num_base_glyph;
  do {
    while( true ) {
      if (local_30 <= mid) {
        return '\0';
      }
      uVar2 = mid + (local_30 - mid >> 1);
      uVar1 = CONCAT11(base_glyph_begin[(ulong)(uVar2 * 6) + 4],
                       base_glyph_begin[(ulong)(uVar2 * 6) + 5]);
      if (glyph_id <= uVar1) break;
      mid = uVar2 + 1;
    }
    local_30 = uVar2;
  } while (glyph_id < uVar1);
  record->gid = uVar1;
  record->paint_offset =
       (ulong)((uint)base_glyph_begin[(ulong)(uVar2 * 6) + 6] << 0x18 |
               (uint)base_glyph_begin[(ulong)(uVar2 * 6) + 7] << 0x10 |
               (uint)base_glyph_begin[(ulong)(uVar2 * 6) + 8] << 8 |
              (uint)base_glyph_begin[(ulong)(uVar2 * 6) + 9]);
  return '\x01';
}

Assistant:

static FT_Bool
  find_base_glyph_v1_record( FT_Byte *           base_glyph_begin,
                             FT_UInt             num_base_glyph,
                             FT_UInt             glyph_id,
                             BaseGlyphV1Record  *record )
  {
    FT_UInt  min = 0;
    FT_UInt  max = num_base_glyph;


    while ( min < max )
    {
      FT_UInt  mid = min + ( max - min ) / 2;

      /*
       * `base_glyph_begin` is the beginning of `BaseGlyphV1List`;
       * skip `numBaseGlyphV1Records` by adding 4 to start binary search
       * in the array of `BaseGlyphV1Record`.
       */
      FT_Byte  *p = base_glyph_begin + 4 + mid * BASE_GLYPH_PAINT_RECORD_SIZE;

      FT_UShort  gid = FT_NEXT_USHORT( p );


      if ( gid < glyph_id )
        min = mid + 1;
      else if (gid > glyph_id )
        max = mid;
      else
      {
        record->gid          = gid;
        record->paint_offset = FT_NEXT_ULONG ( p );
        return 1;
      }
    }

    return 0;
  }